

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::MockCodeGenerator::MockCodeGenerator
          (MockCodeGenerator *this,string_view name)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  bool bVar1;
  string_view __x;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  allocator_type local_41;
  FieldDescriptor *local_40;
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__MockCodeGenerator_01674f90;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name_,&name_local,(allocator<char> *)&local_40);
  this->suppressed_features_ = 0;
  this->minimum_edition_ = EDITION_PROTO2;
  this->maximum_edition_ = EDITION_2023;
  local_40 = GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                       ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                         *)&pb::test);
  this_00 = &this->feature_extensions_;
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(this_00,__l,&local_41);
  __x = compiler::anon_unknown_0::GetTestCase();
  __y._M_str = "no_editions";
  __y._M_len = 0xb;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    *(byte *)&this->suppressed_features_ = (byte)this->suppressed_features_ | 2;
  }
  else {
    __y_00._M_str = "invalid_features";
    __y_00._M_len = 0x10;
    bVar1 = std::operator==(__x,__y_00);
    if (bVar1) {
      local_40 = (FieldDescriptor *)0x0;
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)this_00,&local_40);
    }
    else {
      __y_01._M_str = "no_feature_defaults";
      __y_01._M_len = 0x13;
      bVar1 = std::operator==(__x,__y_01);
      if (bVar1) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)this_00,0,0);
      }
      else {
        __y_02._M_str = "high_maximum";
        __y_02._M_len = 0xc;
        bVar1 = std::operator==(__x,__y_02);
        if (bVar1) {
          this->maximum_edition_ = EDITION_99997_TEST_ONLY;
        }
        else {
          __y_03._M_str = "low_minimum";
          __y_03._M_len = 0xb;
          bVar1 = std::operator==(__x,__y_03);
          if (bVar1) {
            this->maximum_edition_ = EDITION_1_TEST_ONLY;
          }
        }
      }
    }
  }
  return;
}

Assistant:

MockCodeGenerator::MockCodeGenerator(absl::string_view name) : name_(name) {
  absl::string_view key = GetTestCase();
  if (key == "no_editions") {
    suppressed_features_ |= CodeGenerator::FEATURE_SUPPORTS_EDITIONS;
  } else if (key == "invalid_features") {
    feature_extensions_ = {nullptr};
  } else if (key == "no_feature_defaults") {
    feature_extensions_ = {};
  } else if (key == "high_maximum") {
    maximum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (key == "low_minimum") {
    maximum_edition_ = Edition::EDITION_1_TEST_ONLY;
  }
}